

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc.c
# Opt level: O0

void * dlrealloc_in_place(void *oldmem,size_t bytes)

{
  int iVar1;
  int *piVar2;
  mchunkptr pmVar3;
  size_t local_48;
  mchunkptr newp;
  mstate m;
  mchunkptr oldp;
  size_t nb;
  void *mem;
  size_t bytes_local;
  void *oldmem_local;
  
  iVar1 = _gm_.mutex;
  nb = 0;
  if (oldmem != (void *)0x0) {
    if (bytes < 0xffffffffffffff80) {
      if (bytes < 0x17) {
        local_48 = 0x20;
      }
      else {
        local_48 = bytes + 0x17 & 0xfffffffffffffff0;
      }
      if ((_gm_.mflags & 2) != 0) {
        LOCK();
        _gm_.mutex = 1;
        UNLOCK();
        if ((iVar1 != 0) && (iVar1 = spin_acquire_lock(&_gm_.mutex), iVar1 != 0)) {
          return (void *)0x0;
        }
      }
      pmVar3 = try_realloc_chunk(&_gm_,(mchunkptr)((long)oldmem + -0x10),local_48,0);
      if ((_gm_.mflags & 2) != 0) {
        _gm_.mutex = 0;
      }
      if (pmVar3 == (mchunkptr)((long)oldmem + -0x10)) {
        nb = (size_t)oldmem;
      }
    }
    else {
      piVar2 = _PDCLIB_errno_func();
      *piVar2 = 0xc;
    }
  }
  return (void *)nb;
}

Assistant:

void* dlrealloc_in_place(void* oldmem, size_t bytes) {
  void* mem = 0;
  if (oldmem != 0) {
    if (bytes >= MAX_REQUEST) {
      MALLOC_FAILURE_ACTION;
    }
    else {
      size_t nb = request2size(bytes);
      mchunkptr oldp = mem2chunk(oldmem);
#if ! FOOTERS
      mstate m = gm;
#else /* FOOTERS */
      mstate m = get_mstate_for(oldp);
      if (!ok_magic(m)) {
        USAGE_ERROR_ACTION(m, oldmem);
        return 0;
      }
#endif /* FOOTERS */
      if (!PREACTION(m)) {
        mchunkptr newp = try_realloc_chunk(m, oldp, nb, 0);
        POSTACTION(m);
        if (newp == oldp) {
          check_inuse_chunk(m, newp);
          mem = oldmem;
        }
      }
    }
  }
  return mem;
}